

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcarith.c
# Opt level: O0

void start_pass(j_compress_ptr cinfo,boolean gather_statistics)

{
  int iVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  int in_ESI;
  long *in_RDI;
  jpeg_component_info *compptr;
  int tbl;
  int ci;
  arith_entropy_ptr entropy;
  int local_1c;
  
  lVar2 = in_RDI[0x46];
  if (in_ESI != 0) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x31;
    (**(code **)*in_RDI)(in_RDI);
  }
  if ((int)in_RDI[0x2b] == 0) {
    *(code **)(lVar2 + 8) = encode_mcu;
  }
  else if (*(int *)((long)in_RDI + 0x1d4) == 0) {
    if (*(int *)((long)in_RDI + 0x1cc) == 0) {
      *(code **)(lVar2 + 8) = encode_mcu_DC_first;
    }
    else {
      *(code **)(lVar2 + 8) = encode_mcu_AC_first;
    }
  }
  else if (*(int *)((long)in_RDI + 0x1cc) == 0) {
    *(code **)(lVar2 + 8) = encode_mcu_DC_refine;
  }
  else {
    *(code **)(lVar2 + 8) = encode_mcu_AC_refine;
  }
  for (local_1c = 0; local_1c < (int)in_RDI[0x2e]; local_1c = local_1c + 1) {
    lVar3 = in_RDI[(long)local_1c + 0x2f];
    if ((*(int *)((long)in_RDI + 0x1cc) == 0) && (*(int *)((long)in_RDI + 0x1d4) == 0)) {
      iVar1 = *(int *)(lVar3 + 0x14);
      if ((iVar1 < 0) || (0xf < iVar1)) {
        *(undefined4 *)(*in_RDI + 0x28) = 0x32;
        *(int *)(*in_RDI + 0x2c) = iVar1;
        (**(code **)*in_RDI)(in_RDI);
      }
      if (*(long *)(lVar2 + 0x68 + (long)iVar1 * 8) == 0) {
        uVar4 = (**(code **)in_RDI[1])(in_RDI,1,0x40);
        *(undefined8 *)(lVar2 + 0x68 + (long)iVar1 * 8) = uVar4;
      }
      memset(*(void **)(lVar2 + 0x68 + (long)iVar1 * 8),0,0x40);
      *(undefined4 *)(lVar2 + 0x40 + (long)local_1c * 4) = 0;
      *(undefined4 *)(lVar2 + 0x50 + (long)local_1c * 4) = 0;
    }
    if ((int)in_RDI[0x3a] != 0) {
      iVar1 = *(int *)(lVar3 + 0x18);
      if ((iVar1 < 0) || (0xf < iVar1)) {
        *(undefined4 *)(*in_RDI + 0x28) = 0x32;
        *(int *)(*in_RDI + 0x2c) = iVar1;
        (**(code **)*in_RDI)(in_RDI);
      }
      if (*(long *)(lVar2 + 0xe8 + (long)iVar1 * 8) == 0) {
        uVar4 = (**(code **)in_RDI[1])(in_RDI,1,0x100);
        *(undefined8 *)(lVar2 + 0xe8 + (long)iVar1 * 8) = uVar4;
      }
      memset(*(void **)(lVar2 + 0xe8 + (long)iVar1 * 8),0,0x100);
    }
  }
  *(undefined8 *)(lVar2 + 0x18) = 0;
  *(undefined8 *)(lVar2 + 0x20) = 0x10000;
  *(undefined8 *)(lVar2 + 0x28) = 0;
  *(undefined8 *)(lVar2 + 0x30) = 0;
  *(undefined4 *)(lVar2 + 0x38) = 0xb;
  *(undefined4 *)(lVar2 + 0x3c) = 0xffffffff;
  *(undefined4 *)(lVar2 + 0x60) = *(undefined4 *)((long)in_RDI + 0x13c);
  *(undefined4 *)(lVar2 + 100) = 0;
  return;
}

Assistant:

METHODDEF(void)
start_pass (j_compress_ptr cinfo, boolean gather_statistics)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  int ci, tbl;
  jpeg_component_info * compptr;

  if (gather_statistics)
    /* Make sure to avoid that in the master control logic!
     * We are fully adaptive here and need no extra
     * statistics gathering pass!
     */
    ERREXIT(cinfo, JERR_NOT_COMPILED);

  /* We assume jcmaster.c already validated the progressive scan parameters. */

  /* Select execution routines */
  if (cinfo->progressive_mode) {
    if (cinfo->Ah == 0) {
      if (cinfo->Ss == 0)
	entropy->pub.encode_mcu = encode_mcu_DC_first;
      else
	entropy->pub.encode_mcu = encode_mcu_AC_first;
    } else {
      if (cinfo->Ss == 0)
	entropy->pub.encode_mcu = encode_mcu_DC_refine;
      else
	entropy->pub.encode_mcu = encode_mcu_AC_refine;
    }
  } else
    entropy->pub.encode_mcu = encode_mcu;

  /* Allocate & initialize requested statistics areas */
  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    compptr = cinfo->cur_comp_info[ci];
    /* DC needs no table for refinement scan */
    if (cinfo->Ss == 0 && cinfo->Ah == 0) {
      tbl = compptr->dc_tbl_no;
      if (tbl < 0 || tbl >= NUM_ARITH_TBLS)
	ERREXIT1(cinfo, JERR_NO_ARITH_TABLE, tbl);
      if (entropy->dc_stats[tbl] == NULL)
	entropy->dc_stats[tbl] = (unsigned char *) (*cinfo->mem->alloc_small)
	  ((j_common_ptr) cinfo, JPOOL_IMAGE, DC_STAT_BINS);
      MEMZERO(entropy->dc_stats[tbl], DC_STAT_BINS);
      /* Initialize DC predictions to 0 */
      entropy->last_dc_val[ci] = 0;
      entropy->dc_context[ci] = 0;
    }
    /* AC needs no table when not present */
    if (cinfo->Se) {
      tbl = compptr->ac_tbl_no;
      if (tbl < 0 || tbl >= NUM_ARITH_TBLS)
	ERREXIT1(cinfo, JERR_NO_ARITH_TABLE, tbl);
      if (entropy->ac_stats[tbl] == NULL)
	entropy->ac_stats[tbl] = (unsigned char *) (*cinfo->mem->alloc_small)
	  ((j_common_ptr) cinfo, JPOOL_IMAGE, AC_STAT_BINS);
      MEMZERO(entropy->ac_stats[tbl], AC_STAT_BINS);
#ifdef CALCULATE_SPECTRAL_CONDITIONING
      if (cinfo->progressive_mode)
	/* Section G.1.3.2: Set appropriate arithmetic conditioning value Kx */
	cinfo->arith_ac_K[tbl] = cinfo->Ss + ((8 + cinfo->Se - cinfo->Ss) >> 4);
#endif
    }
  }

  /* Initialize arithmetic encoding variables */
  entropy->c = 0;
  entropy->a = 0x10000L;
  entropy->sc = 0;
  entropy->zc = 0;
  entropy->ct = 11;
  entropy->buffer = -1;  /* empty */

  /* Initialize restart stuff */
  entropy->restarts_to_go = cinfo->restart_interval;
  entropy->next_restart_num = 0;
}